

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDASetIncrementFactor(void *ida_mem,sunrealtype dqincfac)

{
  double in_XMM0_Qa;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  IDAMem local_20;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(IDALsMem *)0x11bcea);
  if (local_4 == 0) {
    if (0.0 < in_XMM0_Qa) {
      *(double *)((long)in_stack_ffffffffffffffd8 + 0x78) = in_XMM0_Qa;
      local_4 = 0;
    }
    else {
      IDAProcessError(local_20,-3,0x1a1,"IDASetIncrementFactor",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_ls.c"
                      ,"dqincfac < 0.0 illegal.");
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int IDASetIncrementFactor(void* ida_mem, sunrealtype dqincfac)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* Check for legal dqincfac */
  if (dqincfac <= ZERO)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_NEG_DQINCFAC);
    return (IDALS_ILL_INPUT);
  }

  idals_mem->dqincfac = dqincfac;

  return (IDALS_SUCCESS);
}